

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O0

bool Unit_Test::verifyImage
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,uint8_t value)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  undefined8 uVar7;
  uchar *puVar8;
  uchar *puVar9;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  uchar in_R9B;
  uint8_t *endX;
  uint8_t *outputX;
  uint8_t *endY;
  uint8_t *outputY;
  uint32_t rowSize;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff90;
  uint32_t *in_stack_ffffffffffffff98;
  uchar *local_50;
  char *in_stack_ffffffffffffffb8;
  imageException *in_stack_ffffffffffffffc0;
  
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(in_RDI);
  if (((!bVar1) && (in_ECX != 0)) && (in_R8D != 0)) {
    uVar4 = in_ESI + in_ECX;
    uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI);
    if (uVar4 <= uVar5) {
      uVar6 = in_EDX + in_R8D;
      uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI);
      if (uVar6 <= uVar5) {
        bVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
        Image_Function::OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>>
                  ((uint32_t *)CONCAT44(uVar4,uVar6),in_stack_ffffffffffffff98,
                   in_stack_ffffffffffffff90);
        uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
        puVar8 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
        puVar8 = puVar8 + in_EDX * uVar5;
        bVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
        puVar8 = puVar8 + in_ESI * (uint)bVar3;
        puVar9 = puVar8 + uVar5 * in_R8D;
        do {
          if (puVar8 == puVar9) {
            return true;
          }
          for (local_50 = puVar8; local_50 != puVar8 + in_ECX * (uint)bVar2; local_50 = local_50 + 1
              ) {
            if (*local_50 != in_R9B) {
              return false;
            }
          }
          puVar8 = puVar8 + uVar5;
        } while( true );
      }
    }
  }
  uVar7 = __cxa_allocate_exception(0x28);
  imageException::imageException(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  __cxa_throw(uVar7,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

bool verifyImage( const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, uint8_t value )
    {
        if( image.empty() || width == 0 || height == 0 || x + width > image.width() || y + height > image.height() )
            throw imageException( "Bad input parameters in image function" );

        width = width * image.colorCount();
        Image_Function::OptimiseRoi( width, height, image );

        const uint32_t rowSize  = image.rowSize();
        const uint8_t * outputY = image.data() + y * rowSize + x * image.colorCount();
        const uint8_t * endY    = outputY + rowSize * height;

        for ( ; outputY != endY; outputY += rowSize ) {
            const uint8_t * outputX = outputY;
            const uint8_t * endX    = outputX + width;

            for( ; outputX != endX; ++outputX ) {
                if( (*outputX) != value )
                    return false;
            }
        }

        return true;
    }